

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
::find_soo<google::protobuf::internal::ExtensionInfo>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           *this,key_arg<google::protobuf::internal::ExtensionInfo> *key)

{
  bool bVar1;
  slot_type *slot;
  ExtensionInfo *ts;
  iterator iVar2;
  EqualElement<google::protobuf::internal::ExtensionInfo> local_38;
  key_arg<google::protobuf::internal::ExtensionInfo> *local_28;
  key_arg<google::protobuf::internal::ExtensionInfo> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *this_local;
  
  local_28 = key;
  key_local = (key_arg<google::protobuf::internal::ExtensionInfo> *)this;
  bVar1 = is_soo(this);
  if (!bVar1) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                 );
  }
  bVar1 = empty(this);
  if (!bVar1) {
    local_38.rhs = local_28;
    local_38.eq = eq_ref(this);
    slot = soo_slot(this);
    ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,void>
         ::
         element<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>::EqualElement<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::ExtensionInfo&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>>
                      (&local_38,ts);
    if (bVar1) {
      iVar2 = soo_iterator(this);
      return iVar2;
    }
  }
  iVar2 = end(this);
  return iVar2;
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }